

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.hpp
# Opt level: O2

void __thiscall trng::mrg5s::step(mrg5s *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar1 = (this->S).r[0];
  iVar2 = (this->S).r[1];
  iVar3 = (this->S).r[2];
  iVar4 = (this->S).r[3];
  uVar9 = (long)(this->P).a[3] * (long)iVar4 + (long)(this->P).a[2] * (long)iVar3 +
          (long)(this->P).a[1] * (long)iVar2 + (long)(this->P).a[0] * (long)iVar1;
  uVar8 = uVar9 + 0x8000b0e1c2e43c3e;
  if (uVar9 < 0x7fff4f1e3d1bc3c2) {
    uVar8 = uVar9;
  }
  iVar5 = (this->P).a[4];
  iVar6 = (this->S).r[4];
  (this->S).r[4] = iVar4;
  (this->S).r[3] = iVar3;
  (this->S).r[2] = iVar2;
  (this->S).r[1] = iVar1;
  iVar7 = int_math::modulo_helper<2147461007,_2>::modulo((long)iVar6 * (long)iVar5 + uVar8);
  (this->S).r[0] = iVar7;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5s::step() {
    uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
               static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1]) +
               static_cast<uint64_t>(P.a[2]) * static_cast<uint64_t>(S.r[2]) +
               static_cast<uint64_t>(P.a[3]) * static_cast<uint64_t>(S.r[3])};
    if (t >= static_cast<uint64_t>(2u) * modulus * modulus)
      t -= static_cast<uint64_t>(2u) * modulus * modulus;
    t += static_cast<uint64_t>(P.a[4]) * static_cast<uint64_t>(S.r[4]);
    S.r[4] = S.r[3];
    S.r[3] = S.r[2];
    S.r[2] = S.r[1];
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 5>(t);
  }